

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_carith.c
# Opt level: O2

uint64_t lj_carith_powu64(uint64_t x,uint64_t k)

{
  uint64_t uVar1;
  uint64_t uVar2;
  
  if (k == 0) {
    return 1;
  }
  for (; (k & 1) == 0; k = k >> 1) {
    x = x * x;
  }
  if (1 < k) {
    uVar1 = x;
    while( true ) {
      x = x * x;
      if (k >> 1 == 1) break;
      uVar2 = x;
      if ((k & 2) == 0) {
        uVar2 = 1;
      }
      uVar1 = uVar1 * uVar2;
      k = k >> 1;
    }
    x = x * uVar1;
  }
  return x;
}

Assistant:

uint64_t lj_carith_powu64(uint64_t x, uint64_t k)
{
  uint64_t y;
  if (k == 0)
    return 1;
  for (; (k & 1) == 0; k >>= 1) x *= x;
  y = x;
  if ((k >>= 1) != 0) {
    for (;;) {
      x *= x;
      if (k == 1) break;
      if (k & 1) y *= x;
      k >>= 1;
    }
    y *= x;
  }
  return y;
}